

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_print.c
# Opt level: O0

void easm_print_expr(FILE *out,envy_colors *cols,easm_expr *expr,int lvl)

{
  int lvl_local;
  easm_expr *expr_local;
  envy_colors *cols_local;
  FILE *out_local;
  
  if (((uint)lvl < 0x80000000) || (expr->type != EASM_EXPR_VEC)) {
    if ((lvl < 1) && (expr->type == EASM_EXPR_LOR)) {
      easm_print_expr(out,cols,expr->e1,0);
      fprintf((FILE *)out,"%s||%s",cols->sym,cols->reset);
      easm_print_expr(out,cols,expr->e2,1);
    }
    else if ((lvl < 2) && (expr->type == EASM_EXPR_LAND)) {
      easm_print_expr(out,cols,expr->e1,1);
      fprintf((FILE *)out,"%s&&%s",cols->sym,cols->reset);
      easm_print_expr(out,cols,expr->e2,2);
    }
    else if ((lvl < 3) && (expr->type == EASM_EXPR_OR)) {
      easm_print_expr(out,cols,expr->e1,2);
      fprintf((FILE *)out,"%s|%s",cols->sym,cols->reset);
      easm_print_expr(out,cols,expr->e2,3);
    }
    else if ((lvl < 4) && (expr->type == EASM_EXPR_XOR)) {
      easm_print_expr(out,cols,expr->e1,3);
      fprintf((FILE *)out,"%s^%s",cols->sym,cols->reset);
      easm_print_expr(out,cols,expr->e2,4);
    }
    else if ((lvl < 5) && (expr->type == EASM_EXPR_AND)) {
      easm_print_expr(out,cols,expr->e1,4);
      fprintf((FILE *)out,"%s&%s",cols->sym,cols->reset);
      easm_print_expr(out,cols,expr->e2,5);
    }
    else if ((lvl < 6) && (expr->type == EASM_EXPR_SHL)) {
      easm_print_expr(out,cols,expr->e1,5);
      fprintf((FILE *)out,"%s<<%s",cols->sym,cols->reset);
      easm_print_expr(out,cols,expr->e2,6);
    }
    else if ((lvl < 6) && (expr->type == EASM_EXPR_SHR)) {
      easm_print_expr(out,cols,expr->e1,5);
      fprintf((FILE *)out,"%s>>%s",cols->sym,cols->reset);
      easm_print_expr(out,cols,expr->e2,6);
    }
    else {
      easm_print_sexpr(out,cols,expr,0);
    }
  }
  else {
    easm_print_expr(out,cols,expr->e1,-1);
    fprintf((FILE *)out,"%s:%s",cols->sym);
    easm_print_expr(out,cols,expr->e2,0);
  }
  return;
}

Assistant:

void easm_print_expr(FILE *out, const struct envy_colors *cols, struct easm_expr *expr, int lvl) {
	if (lvl <= -1 && expr->type == EASM_EXPR_VEC) {
		easm_print_expr(out, cols, expr->e1, -1);
		fprintf(out, "%s:%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 0);
	} else if (lvl <= 0 && expr->type == EASM_EXPR_LOR) {
		easm_print_expr(out, cols, expr->e1, 0);
		fprintf(out, "%s||%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 1);
	} else if (lvl <= 1 && expr->type == EASM_EXPR_LAND) {
		easm_print_expr(out, cols, expr->e1, 1);
		fprintf(out, "%s&&%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 2);
	} else if (lvl <= 2 && expr->type == EASM_EXPR_OR) {
		easm_print_expr(out, cols, expr->e1, 2);
		fprintf(out, "%s|%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 3);
	} else if (lvl <= 3 && expr->type == EASM_EXPR_XOR) {
		easm_print_expr(out, cols, expr->e1, 3);
		fprintf(out, "%s^%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 4);
	} else if (lvl <= 4 && expr->type == EASM_EXPR_AND) {
		easm_print_expr(out, cols, expr->e1, 4);
		fprintf(out, "%s&%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 5);
	} else if (lvl <= 5 && expr->type == EASM_EXPR_SHL) {
		easm_print_expr(out, cols, expr->e1, 5);
		fprintf(out, "%s<<%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 6);
	} else if (lvl <= 5 && expr->type == EASM_EXPR_SHR) {
		easm_print_expr(out, cols, expr->e1, 5);
		fprintf(out, "%s>>%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 6);
	} else {
		easm_print_sexpr(out, cols, expr, 0);
	}
}